

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceVariableAccessesWithConstantElements
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *var)

{
  Instruction *access_chain_00;
  pointer def;
  bool bVar1;
  DefUseManager *this_00;
  reference ppIVar2;
  IRContext *context;
  Constant *pCVar3;
  Instruction *access_chain;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  anon_class_8_1_5694ebac aStack_58;
  bool updated;
  function<void_(spvtools::opt::Instruction_*)> local_50;
  undefined1 local_30 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  Instruction *var_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)var;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_30);
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  def = work_list.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  aStack_58.work_list =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       local_30;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceVariableAccessesWithConstantElements(spvtools::opt::Instruction*)const::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_50,&stack0xffffffffffffffa8);
  analysis::DefUseManager::ForEachUser(this_00,(Instruction *)def,&local_50);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_50);
  __range2._7_1_ = false;
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_30);
  access_chain = (Instruction *)
                 std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&access_chain);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    access_chain_00 = *ppIVar2;
    context = Pass::context(&this->super_Pass);
    pCVar3 = descsroautil::GetAccessChainIndexAsConst(context,access_chain_00);
    if (pCVar3 == (Constant *)0x0) {
      ReplaceAccessChain(this,(Instruction *)
                              work_list.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,access_chain_00);
      __range2._7_1_ = true;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_30);
  return __range2._7_1_;
}

Assistant:

bool ReplaceDescArrayAccessUsingVarIndex::
    ReplaceVariableAccessesWithConstantElements(Instruction* var) const {
  std::vector<Instruction*> work_list;
  get_def_use_mgr()->ForEachUser(var, [&work_list](Instruction* use) {
    switch (use->opcode()) {
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
        work_list.push_back(use);
        break;
      default:
        break;
    }
  });

  bool updated = false;
  for (Instruction* access_chain : work_list) {
    if (descsroautil::GetAccessChainIndexAsConst(context(), access_chain) ==
        nullptr) {
      ReplaceAccessChain(var, access_chain);
      updated = true;
    }
  }
  // Note that we do not consider OpLoad and OpCompositeExtract because
  // OpCompositeExtract always has constant literals for indices.
  return updated;
}